

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O1

void __thiscall deqp::egl::ApiCase::expectBoolean(ApiCase *this,EGLBoolean expected,EGLBoolean got)

{
  ostringstream *this_00;
  TestContext *this_01;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  if (expected != got) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR expected: ",0x13);
    local_1b8.m_getName = eglu::getBooleanName;
    local_1b8.m_value = expected;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", Got: ",7);
    local_1c8.m_getName = eglu::getBooleanName;
    local_1c8.m_value = got;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Got invalid value");
    }
  }
  return;
}

Assistant:

void ApiCase::expectBoolean (EGLBoolean expected, EGLBoolean got)
{
	if (expected != got)
	{
		m_testCtx.getLog() << TestLog::Message << "// ERROR expected: " << eglu::getBooleanStr(expected) <<  ", Got: " << eglu::getBooleanStr(got) << TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid value");
	}
}